

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall PrimitiveTestClass::Print(PrimitiveTestClass *this)

{
  ostream *poVar1;
  size_t i_1;
  long lVar2;
  size_t i;
  ulong uVar3;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"c: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)this->c);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"uc: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)this->uc);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"s: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->s);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"us: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->us);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"i: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->i);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"ui: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"l: ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"ul: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"ll: ");
  poVar1 = std::ostream::_M_insert<long_long>((longlong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"ull: ");
  poVar1 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"f: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->f);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"d: ");
  poVar1 = std::ostream::_M_insert<double>(this->d);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"ld: ");
  poVar1 = std::ostream::_M_insert<long_double>(this->ld);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"str: ");
  poVar1 = std::operator<<(poVar1,this->str);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"pc: ");
  PrintArr<char*>(this,this->pc);
  std::operator<<((ostream *)&std::cout,"puc: ");
  PrintArr<unsigned_char*>(this,this->puc);
  std::operator<<((ostream *)&std::cout,"ps: ");
  PrintArr<short*>(this,this->ps);
  std::operator<<((ostream *)&std::cout,"pus: ");
  PrintArr<unsigned_short*>(this,this->pus);
  std::operator<<((ostream *)&std::cout,"pi: ");
  PrintArr<int*>(this,this->pi);
  std::operator<<((ostream *)&std::cout,"pui: ");
  PrintArr<unsigned_int*>(this,this->pui);
  std::operator<<((ostream *)&std::cout,"pl: ");
  PrintArr<long*>(this,this->pl);
  std::operator<<((ostream *)&std::cout,"pul: ");
  PrintArr<unsigned_long*>(this,this->pul);
  std::operator<<((ostream *)&std::cout,"pll: ");
  PrintArr<long_long*>(this,this->pll);
  std::operator<<((ostream *)&std::cout,"pull: ");
  PrintArr<unsigned_long_long*>(this,this->pull);
  std::operator<<((ostream *)&std::cout,"pf: ");
  PrintArr<float*>(this,this->pf);
  std::operator<<((ostream *)&std::cout,"pd: ");
  PrintArr<double*>(this,this->pd);
  std::operator<<((ostream *)&std::cout,"pld: ");
  PrintArr<long_double*>(this,this->pld);
  std::operator<<((ostream *)&std::cout,"pto: ");
  lVar2 = 0;
  for (uVar3 = 0; uVar3 < (ulong)(long)this->SIZE; uVar3 = uVar3 + 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,
                             (string *)((long)&(this->pto->str)._M_dataplus._M_p + lVar2));
    std::operator<<(poVar1,", ");
    lVar2 = lVar2 + 0x20;
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::operator<<((ostream *)&std::cout,"spi: ");
  for (uVar3 = 0; uVar3 < (ulong)(long)this->SIZE; uVar3 = uVar3 + 1) {
    poVar1 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&std::cout,
                        (this->spi).super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                        [uVar3]);
    std::operator<<(poVar1,", ");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::operator<<((ostream *)&std::cout,"spto: ");
  lVar2 = 0;
  for (uVar3 = 0; uVar3 < (ulong)(long)this->SIZE; uVar3 = uVar3 + 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,
                             (string *)
                             ((long)&(((this->spto).
                                       super___shared_ptr<TestArrObj,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_ptr)->str)._M_dataplus._M_p + lVar2));
    std::operator<<(poVar1,", ");
    lVar2 = lVar2 + 0x20;
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void Print()
        {
            cout << "c: " << (int)c << endl; 
            cout << "uc: " << (int)uc << endl; 
            cout << "s: " << s << endl;
            cout << "us: " << us << endl; 
            cout << "i: " << i << endl; 
            cout << "ui: " << ui << endl; 
            cout << "l: " << l << endl; 
            cout << "ul: " << ul << endl; 
            cout << "ll: " << ll << endl; 
            cout << "ull: " << ull << endl; 
            cout << "f: " << f << endl; 
            cout << "d: " << d << endl; 
            cout << "ld: " << ld << endl; 

            cout << "str: " << str << endl;

            cout << "pc: ";
            PrintArr(pc);
            cout << "puc: ";
            PrintArr(puc);
            cout << "ps: ";
            PrintArr(ps);
            cout << "pus: ";
            PrintArr(pus);
            cout << "pi: ";
            PrintArr(pi);
            cout << "pui: ";
            PrintArr(pui);
            cout << "pl: ";
            PrintArr(pl);
            cout << "pul: ";
            PrintArr(pul);
            cout << "pll: ";
            PrintArr(pll);
            cout << "pull: ";
            PrintArr(pull);
            cout << "pf: ";
            PrintArr(pf);
            cout << "pd: ";
            PrintArr(pd);
            cout << "pld: ";
            PrintArr(pld);

            cout << "pto: ";
            for (size_t i = 0; i < SIZE; i++)
            {
                cout << pto[i].str << ", ";
            }
            
            cout << endl;

            cout << "spi: ";
            for (size_t i = 0; i < SIZE; i++)
            {
                cout << (&*spi)[i] << ", ";
            }
            
            cout << endl;

            cout << "spto: ";
            for (size_t i = 0; i < SIZE; i++)
            {
                cout << (&*spto)[i].str << ", ";
            }
            
            cout << endl;
        }